

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

void __thiscall
icu_63::anon_unknown_16::FCDUTF16NFDIterator::~FCDUTF16NFDIterator(FCDUTF16NFDIterator *this)

{
  void *in_RSI;
  
  (this->super_UTF16NFDIterator).super_NFDIterator.super_UObject._vptr_UObject =
       (_func_int **)&PTR__FCDUTF16NFDIterator_003b3970;
  UnicodeString::~UnicodeString(&this->str);
  UObject::~UObject((UObject *)this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

FCDUTF16NFDIterator(const Normalizer2Impl &nfcImpl, const UChar *text, const UChar *textLimit)
            : UTF16NFDIterator(NULL, NULL) {
        UErrorCode errorCode = U_ZERO_ERROR;
        const UChar *spanLimit = nfcImpl.makeFCD(text, textLimit, NULL, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(spanLimit == textLimit || (textLimit == NULL && *spanLimit == 0)) {
            s = text;
            limit = spanLimit;
        } else {
            str.setTo(text, (int32_t)(spanLimit - text));
            {
                ReorderingBuffer r_buffer(nfcImpl, str);
                if(r_buffer.init(str.length(), errorCode)) {
                    nfcImpl.makeFCD(spanLimit, textLimit, &r_buffer, errorCode);
                }
            }
            if(U_SUCCESS(errorCode)) {
                s = str.getBuffer();
                limit = s + str.length();
            }
        }
    }